

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O0

bool __thiscall
Amiga::Audio::Channel::output<(Amiga::Audio::Channel::State)4>(Channel *this,Channel *moduland)

{
  byte local_31;
  bool dma_or_no_interrupt;
  Channel *moduland_local;
  Channel *this_local;
  
  this->period_counter = this->period_counter - 1;
  if (this->period_counter == 0) {
    local_31 = 1;
    if ((this->dma_enabled & 1U) == 0) {
      local_31 = this->interrupt_pending ^ 0xff;
    }
    if ((local_31 & 1) == 0) {
      this_local._7_1_ =
           transit<(Amiga::Audio::Channel::State)4,(Amiga::Audio::Channel::State)0>(this,moduland);
    }
    else {
      this_local._7_1_ =
           transit<(Amiga::Audio::Channel::State)4,(Amiga::Audio::Channel::State)3>(this,moduland);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Audio::Channel::output<Audio::Channel::State::PlayingLow>(Channel *moduland) {
	-- period_counter;

	if(!period_counter) {
		const bool dma_or_no_interrupt = dma_enabled || !interrupt_pending;
		if(dma_or_no_interrupt) {
			return transit<State::PlayingLow, State::PlayingHigh>(moduland);
		} else {
			return transit<State::PlayingLow, State::Disabled>(moduland);
		}
	}

	return false;
}